

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O0

void __thiscall SessionObjectStore::~SessionObjectStore(SessionObjectStore *this)

{
  bool bVar1;
  reference ppSVar2;
  MutexFactory *this_00;
  undefined8 *in_RDI;
  SessionObject *that;
  iterator i;
  set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> cleanUp;
  Mutex *in_stack_ffffffffffffff88;
  set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
  *in_stack_ffffffffffffff90;
  SessionObject *in_stack_ffffffffffffff98;
  _Self local_48;
  _Self local_40 [8];
  
  *in_RDI = &PTR__SessionObjectStore_00223c98;
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::clear
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e5126);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::set
            (in_stack_ffffffffffffff90,
             (set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff88);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::clear
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e5149);
  local_40[0]._M_node =
       (_Base_ptr)
       std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::
       begin((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff88);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::
         end((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_40,&local_48);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<SessionObject_*>::operator*
                        ((_Rb_tree_const_iterator<SessionObject_*> *)in_stack_ffffffffffffff90);
    if (*ppSVar2 != (SessionObject *)0x0) {
      ppSVar2 = std::_Rb_tree_const_iterator<SessionObject_*>::operator*
                          ((_Rb_tree_const_iterator<SessionObject_*> *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff98 = *ppSVar2;
      if (in_stack_ffffffffffffff98 != (SessionObject *)0x0) {
        (*(in_stack_ffffffffffffff98->super_OSObject)._vptr_OSObject[1])();
      }
    }
    std::_Rb_tree_const_iterator<SessionObject_*>::operator++
              ((_Rb_tree_const_iterator<SessionObject_*> *)in_stack_ffffffffffffff98,
               (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,in_stack_ffffffffffffff88);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::~set
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e51fe);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1e520c);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::~set
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e521a);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::~set
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e5228);
  return;
}

Assistant:

SessionObjectStore::~SessionObjectStore()
{
	// Clean up
	objects.clear();
	std::set<SessionObject*> cleanUp = allObjects;
	allObjects.clear();

	for (std::set<SessionObject*>::iterator i = cleanUp.begin(); i != cleanUp.end(); i++)
	{
		if ((*i) == NULL) continue;

		SessionObject* that = *i;
		delete that;
	}

	MutexFactory::i()->recycleMutex(storeMutex);
}